

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_blind_switch
              (secp256k1_context *ctx,uchar *blind_switch,uchar *blind,uint64_t value,
              secp256k1_generator *value_gen,secp256k1_generator *blind_gen,
              secp256k1_pubkey *switch_pubkey)

{
  secp256k1_generator *in_RDX;
  secp256k1_generator *in_RSI;
  uint64_t in_RDI;
  long in_R8;
  long in_R9;
  secp256k1_pedersen_commitment *unaff_retaddr;
  secp256k1_scalar tmp_scalar;
  secp256k1_pubkey tmp_pubkey;
  secp256k1_scalar blind_switch_scalar;
  int overflow;
  uchar hashed [32];
  size_t buflen;
  uchar buf [33];
  secp256k1_pedersen_commitment commit;
  secp256k1_sha256 hasher;
  char *in_stack_fffffffffffffe38;
  secp256k1_callback *in_stack_fffffffffffffe40;
  uchar *in_stack_fffffffffffffe48;
  secp256k1_sha256 *in_stack_fffffffffffffe50;
  secp256k1_scalar *in_stack_fffffffffffffe60;
  secp256k1_scalar *in_stack_fffffffffffffe68;
  secp256k1_sha256 *in_stack_fffffffffffffe70;
  secp256k1_pedersen_commitment *in_stack_fffffffffffffe88;
  uchar *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  uint in_stack_fffffffffffffe9c;
  secp256k1_pubkey *in_stack_fffffffffffffea0;
  size_t *in_stack_fffffffffffffea8;
  uchar *in_stack_fffffffffffffeb0;
  secp256k1_context *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  secp256k1_context *in_stack_fffffffffffffec8;
  secp256k1_sha256 local_a0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_RSI == (secp256k1_generator *)0x0) {
    secp256k1_callback_call(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    iVar1 = 0;
  }
  else if (in_RDX == (secp256k1_generator *)0x0) {
    secp256k1_callback_call(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    iVar1 = 0;
  }
  else if (in_R8 == 0) {
    secp256k1_callback_call(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    iVar1 = 0;
  }
  else if (in_R9 == 0) {
    secp256k1_callback_call(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    iVar1 = 0;
  }
  else if (tmp_scalar.d[0] == 0) {
    secp256k1_callback_call(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    iVar1 = 0;
  }
  else {
    secp256k1_sha256_initialize(&local_a0);
    iVar1 = secp256k1_pedersen_commit
                      ((secp256k1_context *)tmp_scalar.d[0],unaff_retaddr,
                       (uchar *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI
                       ,in_RSI,in_RDX);
    if (iVar1 == 1) {
      iVar1 = secp256k1_pedersen_commitment_serialize
                        ((secp256k1_context *)
                         CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                         in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      if (iVar1 == 1) {
        secp256k1_sha256_write
                  (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                   (size_t)in_stack_fffffffffffffe40);
        memcpy(&stack0xfffffffffffffe60,(void *)tmp_scalar.d[0],0x40);
        iVar1 = secp256k1_ec_pubkey_tweak_mul
                          (in_stack_fffffffffffffec8,
                           (secp256k1_pubkey *)
                           CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                           (uchar *)in_stack_fffffffffffffeb8);
        if (iVar1 == 1) {
          iVar1 = secp256k1_ec_pubkey_serialize
                            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                             in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                             in_stack_fffffffffffffe9c);
          if (iVar1 == 1) {
            secp256k1_sha256_write
                      (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                       (size_t)in_stack_fffffffffffffe40);
            secp256k1_sha256_finalize(in_stack_fffffffffffffe70,(uchar *)in_stack_fffffffffffffe68);
            secp256k1_scalar_set_b32
                      ((secp256k1_scalar *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                       (int *)in_stack_fffffffffffffe40);
            if (in_stack_fffffffffffffec4 == 0) {
              secp256k1_scalar_set_b32
                        ((secp256k1_scalar *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                         (int *)in_stack_fffffffffffffe40);
              if (in_stack_fffffffffffffec4 == 0) {
                secp256k1_scalar_add
                          ((secp256k1_scalar *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                           in_stack_fffffffffffffe60);
                secp256k1_scalar_get_b32(in_RSI->data,(secp256k1_scalar *)&stack0xfffffffffffffea0);
                secp256k1_scalar_clear((secp256k1_scalar *)&stack0xfffffffffffffea0);
                secp256k1_scalar_clear((secp256k1_scalar *)&stack0xfffffffffffffe40);
                iVar1 = 1;
              }
              else {
                secp256k1_scalar_clear((secp256k1_scalar *)&stack0xfffffffffffffea0);
                secp256k1_scalar_clear((secp256k1_scalar *)&stack0xfffffffffffffe40);
                iVar1 = 0;
              }
            }
            else {
              secp256k1_scalar_clear((secp256k1_scalar *)&stack0xfffffffffffffea0);
              iVar1 = 0;
            }
          }
          else {
            iVar1 = 0;
          }
        }
        else {
          iVar1 = 0;
        }
      }
      else {
        iVar1 = 0;
      }
    }
    else {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int secp256k1_blind_switch(const secp256k1_context* ctx, unsigned char* blind_switch, const unsigned char* blind, uint64_t value, const secp256k1_generator* value_gen, const secp256k1_generator* blind_gen, const secp256k1_pubkey* switch_pubkey) {
    secp256k1_sha256 hasher;
    secp256k1_pedersen_commitment commit;
    unsigned char buf[33];
    size_t buflen = sizeof(buf);
    unsigned char hashed[32];
    int overflow;
    secp256k1_scalar blind_switch_scalar;
    secp256k1_pubkey tmp_pubkey;
    secp256k1_scalar tmp_scalar;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(blind_switch != NULL);
    ARG_CHECK(blind != NULL);
    ARG_CHECK(value_gen != NULL);
    ARG_CHECK(blind_gen != NULL);
    ARG_CHECK(switch_pubkey != NULL);

    secp256k1_sha256_initialize(&hasher);
    /* xG + vH */
    if (secp256k1_pedersen_commit(ctx, &commit, blind, value, value_gen, blind_gen) != 1) {
        return 0;
    }
    if (secp256k1_pedersen_commitment_serialize(ctx, buf, &commit) != 1) {
        return 0;
    }
    secp256k1_sha256_write(&hasher, buf, buflen);

    /* xJ */
    tmp_pubkey = *switch_pubkey;
    if (secp256k1_ec_pubkey_tweak_mul(ctx, &tmp_pubkey, blind) != 1) {
        return 0;
    }
    if (secp256k1_ec_pubkey_serialize(ctx, buf, &buflen, &tmp_pubkey, SECP256K1_EC_COMPRESSED) != 1) {
        return 0;
    }
    secp256k1_sha256_write(&hasher, buf, buflen);
    secp256k1_sha256_finalize(&hasher, hashed);
    secp256k1_scalar_set_b32(&blind_switch_scalar, hashed, &overflow); /* hash(xG+vH||xJ) */
    if (overflow) {
        secp256k1_scalar_clear(&blind_switch_scalar);
        return 0;
    }
    secp256k1_scalar_set_b32(&tmp_scalar, blind, &overflow);
    if (overflow) {
        secp256k1_scalar_clear(&blind_switch_scalar);
        secp256k1_scalar_clear(&tmp_scalar);
        return 0;
    }
    secp256k1_scalar_add(&blind_switch_scalar, &blind_switch_scalar, &tmp_scalar); /* x + hash(xG+vH||xJ) */
    secp256k1_scalar_get_b32(blind_switch, &blind_switch_scalar);
    secp256k1_scalar_clear(&blind_switch_scalar);
    secp256k1_scalar_clear(&tmp_scalar);
    return 1;
}